

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

string * __thiscall
flatbuffers::FlatBufMethod::name_abi_cxx11_(string *__return_storage_ptr__,FlatBufMethod *this)

{
  RPCCall *pRVar1;
  pointer pcVar2;
  
  pRVar1 = this->method_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pRVar1->super_Definition).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pRVar1->super_Definition).name._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return method_->name; }